

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

void * handle_accept(void *arg)

{
  int __fd;
  ulong uVar1;
  int __epfd;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  iterator iVar6;
  mapped_type *this;
  size_t sVar7;
  size_t sVar8;
  bool bVar9;
  CharContent res_content_3;
  epoll_event event_ret;
  size_t all;
  CharContent ret_request;
  HttpResponse http_response;
  Request request;
  Response response;
  source server_resource;
  CharContent res;
  HttpRequest http_parser;
  char buf [1024];
  CharContent local_e28;
  undefined1 local_dfc [12];
  ulong local_df0;
  CharContent local_de8;
  HttpResponse local_dc0;
  undefined1 local_d80 [160];
  _Hashtable<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_ce0;
  CharContent local_ca8;
  CharContent local_c80;
  CharContent local_c58;
  CharContent local_c30;
  CharContent local_c08;
  CharContent local_be0;
  CharContent local_bb8;
  CharContent local_b90;
  CharContent local_b68;
  Response local_b40;
  undefined1 local_a78 [200];
  Request local_9b0;
  CharContent local_8d8 [25];
  HttpRequest local_4d8;
  epoll_event local_438 [64];
  
  __fd = *arg;
  operator_delete(arg);
  local_d80._0_8_ = &PTR__CharContent_00117c48;
  local_d80._8_8_ = 0xffffffffffffffff;
  local_d80._16_8_ = operator_new__(10);
  local_d80._24_8_ = 0;
  local_d80._32_8_ = 10;
  *(char *)(local_d80._16_8_ + 0) = '\0';
  *(char *)(local_d80._16_8_ + 1) = '\0';
  *(char *)(local_d80._16_8_ + 2) = '\0';
  *(char *)(local_d80._16_8_ + 3) = '\0';
  *(char *)(local_d80._16_8_ + 4) = '\0';
  *(char *)(local_d80._16_8_ + 5) = '\0';
  *(char *)(local_d80._16_8_ + 6) = '\0';
  *(char *)(local_d80._16_8_ + 7) = '\0';
  *(char *)(local_d80._16_8_ + 8) = '\0';
  *(char *)(local_d80._16_8_ + 9) = '\0';
  local_d80._40_8_ = &PTR__CharContent_00117c48;
  local_d80._48_8_ = 0xffffffffffffffff;
  local_d80._56_8_ = operator_new__(10);
  local_d80._64_8_ = 0;
  local_d80._72_8_ = 10;
  *(char *)(local_d80._56_8_ + 0) = '\0';
  *(char *)(local_d80._56_8_ + 1) = '\0';
  *(char *)(local_d80._56_8_ + 2) = '\0';
  *(char *)(local_d80._56_8_ + 3) = '\0';
  *(char *)(local_d80._56_8_ + 4) = '\0';
  *(char *)(local_d80._56_8_ + 5) = '\0';
  *(char *)(local_d80._56_8_ + 6) = '\0';
  *(char *)(local_d80._56_8_ + 7) = '\0';
  *(char *)(local_d80._56_8_ + 8) = '\0';
  *(char *)(local_d80._56_8_ + 9) = '\0';
  local_d80._80_8_ = &PTR__CharContent_00117c48;
  local_d80._88_8_ = 0xffffffffffffffff;
  local_d80._96_8_ = operator_new__(10);
  local_d80._104_8_ = 0;
  local_d80._112_8_ = 10;
  *(char *)(local_d80._96_8_ + 0) = '\0';
  *(char *)(local_d80._96_8_ + 1) = '\0';
  *(char *)(local_d80._96_8_ + 2) = '\0';
  *(char *)(local_d80._96_8_ + 3) = '\0';
  *(char *)(local_d80._96_8_ + 4) = '\0';
  *(char *)(local_d80._96_8_ + 5) = '\0';
  *(char *)(local_d80._96_8_ + 6) = '\0';
  *(char *)(local_d80._96_8_ + 7) = '\0';
  *(char *)(local_d80._96_8_ + 8) = '\0';
  *(char *)(local_d80._96_8_ + 9) = '\0';
  local_d80._120_8_ = &PTR__CharContent_00117c48;
  local_d80._128_8_ = 0xffffffffffffffff;
  local_d80._136_8_ = operator_new__(10);
  local_ce0._M_buckets = (__buckets_ptr)(local_d80 + 0xd0);
  local_d80._144_8_ = 0;
  local_d80._152_8_ = 10;
  *(char *)(local_d80._136_8_ + 0) = '\0';
  *(char *)(local_d80._136_8_ + 1) = '\0';
  *(char *)(local_d80._136_8_ + 2) = '\0';
  *(char *)(local_d80._136_8_ + 3) = '\0';
  *(char *)(local_d80._136_8_ + 4) = '\0';
  *(char *)(local_d80._136_8_ + 5) = '\0';
  *(char *)(local_d80._136_8_ + 6) = '\0';
  *(char *)(local_d80._136_8_ + 7) = '\0';
  *(char *)(local_d80._136_8_ + 8) = '\0';
  *(char *)(local_d80._136_8_ + 9) = '\0';
  local_ce0._M_bucket_count = 1;
  local_ce0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_ce0._M_element_count = 0;
  local_ce0._M_rehash_policy._M_max_load_factor = 1.0;
  local_ce0._M_rehash_policy._M_next_resize = 0;
  local_ce0._M_single_bucket = (__node_base_ptr)0x0;
  local_b40.code._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
  local_b40.code.npos = 0xffffffffffffffff;
  local_b40.code.m = (char *)operator_new__(10);
  local_b40.code.size = 0;
  local_b40.code.m_length = 10;
  local_b40.code.m[0] = '\0';
  local_b40.code.m[1] = '\0';
  local_b40.code.m[2] = '\0';
  local_b40.code.m[3] = '\0';
  local_b40.code.m[4] = '\0';
  local_b40.code.m[5] = '\0';
  local_b40.code.m[6] = '\0';
  local_b40.code.m[7] = '\0';
  local_b40.code.m[8] = '\0';
  local_b40.code.m[9] = '\0';
  local_b40.protocol._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
  local_b40.protocol.npos = 0xffffffffffffffff;
  local_b40.protocol.m = (char *)operator_new__(10);
  local_b40.protocol.size = 0;
  local_b40.protocol.m_length = 10;
  local_b40.protocol.m[0] = '\0';
  local_b40.protocol.m[1] = '\0';
  local_b40.protocol.m[2] = '\0';
  local_b40.protocol.m[3] = '\0';
  local_b40.protocol.m[4] = '\0';
  local_b40.protocol.m[5] = '\0';
  local_b40.protocol.m[6] = '\0';
  local_b40.protocol.m[7] = '\0';
  local_b40.protocol.m[8] = '\0';
  local_b40.protocol.m[9] = '\0';
  local_b40.Entity._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
  local_b40.Entity.npos = 0xffffffffffffffff;
  local_b40.Entity.m = (char *)operator_new__(10);
  local_b40.headers._M_h._M_buckets = &local_b40.headers._M_h._M_single_bucket;
  local_b40.Entity.size = 0;
  local_b40.Entity.m_length = 10;
  local_b40.Entity.m[0] = '\0';
  local_b40.Entity.m[1] = '\0';
  local_b40.Entity.m[2] = '\0';
  local_b40.Entity.m[3] = '\0';
  local_b40.Entity.m[4] = '\0';
  local_b40.Entity.m[5] = '\0';
  local_b40.Entity.m[6] = '\0';
  local_b40.Entity.m[7] = '\0';
  local_b40.Entity.m[8] = '\0';
  local_b40.Entity.m[9] = '\0';
  local_b40.headers._M_h._M_bucket_count = 1;
  local_b40.headers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b40.headers._M_h._M_element_count = 0;
  local_b40.headers._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_b40.headers._M_h._M_rehash_policy._M_next_resize = 0;
  local_b40.headers._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_b40.cookies.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b40.cookies.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b40.cookies.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  HttpResponse::HttpResponse(&local_dc0);
  __epfd = epoll_create(1);
  local_438[0].events = 1;
  local_438[0]._4_4_ = __fd;
  epoll_ctl(__epfd,1,__fd,local_438);
  local_de8._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
  local_de8.npos = 0xffffffffffffffff;
  local_de8.m = (char *)operator_new__(10);
  local_de8.size = 0;
  local_de8.m_length = 10;
  local_de8.m[0] = '\0';
  local_de8.m[1] = '\0';
  local_de8.m[2] = '\0';
  local_de8.m[3] = '\0';
  local_de8.m[4] = '\0';
  local_de8.m[5] = '\0';
  local_de8.m[6] = '\0';
  local_de8.m[7] = '\0';
  local_de8.m[8] = '\0';
  local_de8.m[9] = '\0';
  memset(local_438,0,0x400);
  sVar8 = 0xffffffffffffffff;
  do {
    uVar2 = epoll_wait(__epfd,(epoll_event *)local_dfc,1,15000);
    if ((int)uVar2 < 1) break;
    bVar9 = true;
    if ((local_dfc._4_4_ == __fd) && ((local_dfc[0] & 1) != 0)) {
      sVar8 = read(__fd,local_438,0x400);
      if ((long)sVar8 < 1) {
        bVar9 = false;
      }
      else {
        CharContent::append(&local_de8,(char *)local_438,sVar8);
        memset(local_438,0,0x400);
        CharContent::CharContent(local_8d8,"\r\n\r\n");
        sVar4 = CharContent::find(&local_de8,local_8d8,0);
        bVar9 = sVar4 == local_de8.npos;
        local_8d8[0]._vptr_CharContent._0_4_ = 0x117c48;
        local_8d8[0]._vptr_CharContent._4_4_ = 0;
        if ((pointer)local_8d8[0].m != (pointer)0x0) {
          operator_delete__(local_8d8[0].m);
        }
      }
    }
  } while (bVar9);
  pcVar5 = CharContent::c_str(&local_de8);
  sVar4 = CharContent::length(&local_de8);
  write(1,pcVar5,sVar4);
  sVar4 = local_de8.m_length;
  if ((int)uVar2 < 0) {
    CharContent::CharContent(&local_b68,"500");
    HttpResponse::response_content((CharContent *)local_a78,&local_dc0,&local_b68);
    local_b68._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
    if (local_b68.m != (char *)0x0) {
      operator_delete__(local_b68.m);
    }
    memset(local_8d8,0,200);
    snprintf((char *)local_8d8,200,"ret_num %d\n",(ulong)uVar2);
    sVar7 = strlen((char *)local_8d8);
    write(1,local_8d8,sVar7);
    response_to_client((CharContent *)local_a78,__fd);
  }
  else {
    if (-1 < (long)sVar8) {
      local_ca8._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
      local_ca8.npos = 0xffffffffffffffff;
      pcVar5 = (char *)operator_new__(local_de8.m_length);
      local_ca8.size = local_de8.size;
      local_ca8.m_length = sVar4;
      local_ca8.m = pcVar5;
      memset(pcVar5,0,sVar4);
      memmove(pcVar5,local_de8.m,sVar4);
      HttpRequest::HttpRequest(&local_4d8,&local_ca8);
      local_ca8._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
      if (local_ca8.m != (char *)0x0) {
        operator_delete__(local_ca8.m);
      }
      bVar9 = HttpRequest::handle_request(&local_4d8,(Request *)local_d80);
      if (bVar9) {
        CharContent::CharContent(local_8d8,"Content-Length");
        iVar6 = std::
                _Hashtable<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find((_Hashtable<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)(local_d80 + 0xa0),local_8d8);
        local_8d8[0]._vptr_CharContent._0_4_ = 0x117c48;
        local_8d8[0]._vptr_CharContent._4_4_ = 0;
        if ((pointer)local_8d8[0].m != (pointer)0x0) {
          operator_delete__(local_8d8[0].m);
        }
        if (iVar6.super__Node_iterator_base<std::pair<const_CharContent,_CharContent>,_true>._M_cur
            != (__node_type *)0x0) {
          local_df0 = 0;
          CharContent::CharContent(local_8d8,"Content-Length");
          this = std::__detail::
                 _Map_base<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)(local_d80 + 0xa0),local_8d8);
          pcVar5 = CharContent::c_str(this);
          __isoc99_sscanf(pcVar5,"%lu",&local_df0);
          local_8d8[0]._vptr_CharContent._0_4_ = 0x117c48;
          local_8d8[0]._vptr_CharContent._4_4_ = 0;
          if ((pointer)local_8d8[0].m != (pointer)0x0) {
            operator_delete__(local_8d8[0].m);
          }
          sVar8 = 0;
          memset(local_8d8,0,0x400);
          uVar2 = 0xffffffff;
          do {
            uVar1 = local_df0;
            sVar4 = CharContent::length((CharContent *)(local_d80 + 0x78));
            if ((uVar1 <= sVar4) ||
               (uVar2 = epoll_wait(__epfd,(epoll_event *)local_dfc,1,20000), (int)uVar2 < 1)) break;
            bVar9 = true;
            if ((local_dfc._4_4_ == __fd) && ((local_dfc[0] & 1) != 0)) {
              sVar8 = read(__fd,local_8d8,0x400);
              if ((long)sVar8 < 1) {
                bVar9 = false;
              }
              else {
                CharContent::append((CharContent *)(local_d80 + 0x78),(char *)local_8d8,sVar8);
                memset(local_8d8,0,0x400);
              }
            }
          } while (bVar9);
          if ((int)uVar2 < 0) {
            CharContent::CharContent(&local_be0,"500");
            HttpResponse::response_content(&local_e28,&local_dc0,&local_be0);
            local_be0._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
            if (local_be0.m != (char *)0x0) {
              operator_delete__(local_be0.m);
            }
            memset(local_a78,0,200);
            snprintf(local_a78,200,"epoll_ret_num %d\n",(ulong)uVar2);
            sVar7 = strlen(local_a78);
            write(1,local_a78,sVar7);
            response_to_client(&local_e28,__fd);
          }
          else {
            if (-1 < (long)sVar8) goto LAB_0010dbdc;
            CharContent::CharContent(&local_c08,"500");
            HttpResponse::response_content(&local_e28,&local_dc0,&local_c08);
            local_c08._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
            if (local_c08.m != (char *)0x0) {
              operator_delete__(local_c08.m);
            }
            memset(local_a78,0,200);
            snprintf(local_a78,200,"entity_read_size %lu\n",sVar8);
            sVar7 = strlen(local_a78);
            write(1,local_a78,sVar7);
            response_to_client(&local_e28,__fd);
          }
          local_e28._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
          goto LAB_0010e2a4;
        }
LAB_0010dbdc:
        local_8d8[0]._vptr_CharContent._0_4_ = 1;
        local_8d8[0]._vptr_CharContent._4_4_ = __fd;
        epoll_ctl(__epfd,2,__fd,(epoll_event *)local_8d8);
        source::source((source *)local_a78,__fd);
        Request::Request(&local_9b0,(Request *)local_d80);
        iVar3 = source::resource_find((source *)local_a78,&local_9b0,&local_b40);
        std::
        _Hashtable<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&local_9b0.headers._M_h);
        local_9b0.Entity._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
        if (local_9b0.Entity.m != (char *)0x0) {
          operator_delete__(local_9b0.Entity.m);
        }
        local_9b0.protocol._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
        if (local_9b0.protocol.m != (char *)0x0) {
          operator_delete__(local_9b0.protocol.m);
        }
        local_9b0.uri._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
        if (local_9b0.uri.m != (char *)0x0) {
          operator_delete__(local_9b0.uri.m);
        }
        local_9b0.method._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
        if (local_9b0.method.m != (char *)0x0) {
          operator_delete__(local_9b0.method.m);
        }
        if (iVar3 == 3) {
          CharContent::CharContent(&local_c80,"500");
          HttpResponse::response_content(&local_e28,&local_dc0,&local_c80);
          local_c80._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
          if (local_c80.m != (char *)0x0) {
            operator_delete__(local_c80.m);
          }
          memset(local_8d8,0,200);
          snprintf((char *)local_8d8,200,"resource_find_ret %d\n",3);
          sVar7 = strlen((char *)local_8d8);
          write(1,local_8d8,sVar7);
          response_to_client(&local_e28,__fd);
LAB_0010e182:
          local_e28._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
        }
        else {
          if (iVar3 == 2) {
            CharContent::CharContent(&local_c58,"400");
            HttpResponse::response_content(&local_e28,&local_dc0,&local_c58);
            local_c58._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
            if (local_c58.m != (char *)0x0) {
              operator_delete__(local_c58.m);
            }
            memset(local_8d8,0,200);
            snprintf((char *)local_8d8,200,"resource_find_ret %d\n",2);
            sVar7 = strlen((char *)local_8d8);
            write(1,local_8d8,sVar7);
            response_to_client(&local_e28,__fd);
            goto LAB_0010e182;
          }
          if (iVar3 == 1) {
            CharContent::CharContent(&local_c30,"404");
            HttpResponse::response_content(&local_e28,&local_dc0,&local_c30);
            local_c30._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
            if (local_c30.m != (char *)0x0) {
              operator_delete__(local_c30.m);
            }
            memset(local_8d8,0,200);
            snprintf((char *)local_8d8,200,"resource_find_ret %d\n",1);
            sVar7 = strlen((char *)local_8d8);
            write(1,local_8d8,sVar7);
            response_to_client(&local_e28,__fd);
            goto LAB_0010e182;
          }
          HttpResponse::response_content(local_8d8,&local_dc0,&local_b40,(Request *)local_d80);
          response_to_client(local_8d8,__fd);
          local_8d8[0]._vptr_CharContent._0_4_ = 0x117c48;
          local_8d8[0]._vptr_CharContent._4_4_ = 0;
          local_e28.m = local_8d8[0].m;
        }
        if ((pointer)local_e28.m != (pointer)0x0) {
          operator_delete__(local_e28.m);
        }
        local_a78._0_8_ = &PTR__source_00117cd8;
        std::vector<map_item,_std::allocator<map_item>_>::~vector
                  ((vector<map_item,_std::allocator<map_item>_> *)(local_a78 + 0x10));
      }
      else {
        CharContent::CharContent(&local_bb8,"400");
        HttpResponse::response_content((CharContent *)local_a78,&local_dc0,&local_bb8);
        local_bb8._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
        if (local_bb8.m != (char *)0x0) {
          operator_delete__(local_bb8.m);
        }
        memset((void *)((long)&local_8d8[0].npos + 5),0,0xbb);
        local_8d8[0]._vptr_CharContent._0_4_ = 0x70747468;
        local_8d8[0]._vptr_CharContent._4_4_ = 0x7261705f;
        local_8d8[0].npos._0_5_ = 0xa726573;
        sVar7 = strlen((char *)local_8d8);
        write(1,local_8d8,sVar7);
        response_to_client((CharContent *)local_a78,__fd);
        local_a78._0_8_ = &PTR__CharContent_00117c48;
        local_e28.m = (char *)local_a78._16_8_;
LAB_0010e2a4:
        if ((pointer)local_e28.m != (pointer)0x0) {
          operator_delete__(local_e28.m);
        }
      }
      HttpRequest::~HttpRequest(&local_4d8);
      goto LAB_0010e2bb;
    }
    CharContent::CharContent(&local_b90,"500");
    HttpResponse::response_content((CharContent *)local_a78,&local_dc0,&local_b90);
    local_b90._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
    if (local_b90.m != (char *)0x0) {
      operator_delete__(local_b90.m);
    }
    memset(local_8d8,0,200);
    snprintf((char *)local_8d8,200,"read_size %lu\n",sVar8);
    sVar7 = strlen((char *)local_8d8);
    write(1,local_8d8,sVar7);
    response_to_client((CharContent *)local_a78,__fd);
  }
  local_a78._0_8_ = &PTR__CharContent_00117c48;
  if ((pointer)local_a78._16_8_ != (pointer)0x0) {
    operator_delete__((void *)local_a78._16_8_);
  }
LAB_0010e2bb:
  local_de8._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
  if (local_de8.m != (char *)0x0) {
    operator_delete__(local_de8.m);
  }
  close(__epfd);
  local_dc0._vptr_HttpResponse = (_func_int **)&PTR__HttpResponse_00117c78;
  std::
  _Hashtable<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_dc0.response_code_map._M_h);
  std::vector<CharContent,_std::allocator<CharContent>_>::~vector(&local_b40.cookies);
  std::
  _Hashtable<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_b40.headers._M_h);
  local_b40.Entity._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
  if (local_b40.Entity.m != (char *)0x0) {
    operator_delete__(local_b40.Entity.m);
  }
  local_b40.protocol._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
  if (local_b40.protocol.m != (char *)0x0) {
    operator_delete__(local_b40.protocol.m);
  }
  local_b40.code._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
  if (local_b40.code.m != (char *)0x0) {
    operator_delete__(local_b40.code.m);
  }
  std::
  _Hashtable<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<CharContent,_std::pair<const_CharContent,_CharContent>,_std::allocator<std::pair<const_CharContent,_CharContent>_>,_std::__detail::_Select1st,_EqualFunc,_hashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_d80 + 0xa0));
  local_d80._120_8_ = &PTR__CharContent_00117c48;
  if ((char *)local_d80._136_8_ != (char *)0x0) {
    operator_delete__((void *)local_d80._136_8_);
  }
  local_d80._80_8_ = &PTR__CharContent_00117c48;
  if ((char *)local_d80._96_8_ != (char *)0x0) {
    operator_delete__((void *)local_d80._96_8_);
  }
  local_d80._40_8_ = &PTR__CharContent_00117c48;
  if ((char *)local_d80._56_8_ != (char *)0x0) {
    operator_delete__((void *)local_d80._56_8_);
  }
  local_d80._0_8_ = &PTR__CharContent_00117c48;
  if ((char *)local_d80._16_8_ != (char *)0x0) {
    operator_delete__((void *)local_d80._16_8_);
  }
  return (void *)0x0;
}

Assistant:

void *handle_accept(void *arg){
    int *ptr=(int *)arg;
    int connfd=*ptr;
    delete ptr;

    Request request;
    Response response;
    HttpResponse http_response;


    Epoll e(1);
    e.make_ctl(EPOLL_CTL_ADD,connfd,EPOLLIN);
    int epoll_fd=e.get_epoll_fd();
    epoll_event event_ret;
    int ret_num=-1;
    ssize_t read_size=-1;
    CharContent ret_request;
    char buf[1024]={'\0'};
    while(true){
        ret_num=epoll_wait(epoll_fd,&event_ret,1,15000);
        if(ret_num<1){
            break;
        }
        int ret_fd=event_ret.data.fd;
        if(ret_fd==connfd&&(event_ret.events&EPOLLIN)){
            read_size=read(connfd,buf,sizeof(buf));
            if(read_size<=0){
                break;
            }
            ret_request.append(buf,read_size);
            memset(buf,'\0',sizeof(buf));
            if(ret_request.find(CharContent("\r\n\r\n"))!=ret_request.npos){
                break;
            }
        }
    }
    write(STDOUT_FILENO,ret_request.c_str(),ret_request.length());
    if(ret_num<0){
        CharContent res_content(http_response.response_content(CharContent("500")));
        char v_log[200]={'\0'};
        snprintf(v_log,sizeof(v_log),"ret_num %d\n",ret_num);
        log(v_log);
        return response_to_client(res_content,connfd);
    }
    if(read_size<0){
        CharContent res_content(http_response.response_content(CharContent("500")));
        char v_log[200]={'\0'};
        snprintf(v_log,sizeof(v_log),"read_size %lu\n",read_size);
        log(v_log);
        return response_to_client(res_content,connfd);
    }
    HttpRequest http_parser(ret_request);
    if(!http_parser.handle_request(&request)){
        CharContent res_content(http_response.response_content(CharContent("400")));
        char v_log[200]={'\0'};
        snprintf(v_log,sizeof(v_log),"http_parser\n");
        log(v_log);
        return response_to_client(res_content,connfd);
    }
    if(request.headers.find(CharContent("Content-Length"))!=request.headers.end()){
        size_t all=0;
        sscanf(request.headers["Content-Length"].c_str(),"%lu",&all);
        int epoll_ret_num=-1;
        ssize_t entity_read_size=0;
        char entity_buf[1024]={'\0'};
        while(true){
            if(all<=request.Entity.length()){
                break;
            }
            epoll_ret_num=epoll_wait(epoll_fd,&event_ret,1,20000);
            if(epoll_ret_num<1){
                break;
            }
            int ret_fd=event_ret.data.fd;
            if(ret_fd==connfd&&(event_ret.events&EPOLLIN)){
                entity_read_size=read(connfd,entity_buf,sizeof(entity_buf));
                if(entity_read_size<=0){
                    break;
                }
                request.Entity.append(entity_buf,entity_read_size);
                memset(entity_buf,'\0',sizeof(entity_buf));
            }
        }
        if(epoll_ret_num<0){
            CharContent res_content(http_response.response_content(CharContent("500")));
            char v_log[200]={'\0'};
            snprintf(v_log,sizeof(v_log),"epoll_ret_num %d\n",epoll_ret_num);
            log(v_log);
            return response_to_client(res_content,connfd);
        }
        if(entity_read_size<0){
            CharContent res_content(http_response.response_content(CharContent("500")));
            char v_log[200]={'\0'};
            snprintf(v_log,sizeof(v_log),"entity_read_size %lu\n",entity_read_size);
            log(v_log);
            return response_to_client(res_content,connfd);
        }
    }
    e.make_ctl(EPOLL_CTL_DEL,connfd,EPOLLIN);
    source server_resource(connfd);
    int resource_find_ret=server_resource.resource_find(request,&response);
    /*
     * 0 ok
     * 1 not find resource
     * 2 file type unknow(not file or document)
     * 3 exec error
     */
    if(resource_find_ret==1){
        CharContent res_content(http_response.response_content(CharContent("404")));
        char v_log[200]={'\0'};
        snprintf(v_log,sizeof(v_log),"resource_find_ret %d\n",resource_find_ret);
        log(v_log);
        return response_to_client(res_content,connfd);
    }
    if(resource_find_ret==2){
        CharContent res_content(http_response.response_content(CharContent("400")));
        char v_log[200]={'\0'};
        snprintf(v_log,sizeof(v_log),"resource_find_ret %d\n",resource_find_ret);
        log(v_log);
        return response_to_client(res_content,connfd);
    }
    if(resource_find_ret==3){
        CharContent res_content(http_response.response_content(CharContent("500")));
        char v_log[200]={'\0'};
        snprintf(v_log,sizeof(v_log),"resource_find_ret %d\n",resource_find_ret);
        log(v_log);
        return response_to_client(res_content,connfd);
    }
    CharContent res(http_response.response_content(&response,&request));
    return response_to_client(res,connfd);
}